

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,char **value)

{
  bool bVar1;
  ostream *in_RAX;
  size_t sVar2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar3;
  char *__s;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX;
  Message::Message((Message *)&local_28);
  __s = *value;
  if (__s == (char *)0x0) {
    sVar3.ptr_ = local_28.ptr_ + 0x10;
    sVar2 = 6;
    __s = "(null)";
  }
  else {
    sVar3.ptr_ = local_28.ptr_;
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      sVar3.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_28.ptr_ + 0x10);
    }
    sVar2 = strlen(__s);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar3.ptr_,__s,sVar2);
  AppendMessage(this,(Message *)&local_28);
  if (local_28.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = internal::IsTrue(true);
    if ((bVar1) &&
       (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_28.ptr_ + 8))();
    }
  }
  return this;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }